

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O3

void __thiscall QGles2Buffer::destroy(QGles2Buffer *this)

{
  anon_struct_4_1_4eff857e_for_buffer aVar1;
  QRhiImplementation *pQVar2;
  long in_FS_OFFSET;
  DeferredReleaseEntry local_34;
  QGles2Buffer *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::clear();
  aVar1.buffer = this->buffer;
  if (aVar1.buffer != 0) {
    local_34.field_1.renderbuffer.renderbuffer2 = 0xaaaaaaaa;
    local_34.type = Buffer;
    this->buffer = 0;
    pQVar2 = (this->super_QRhiBuffer).super_QRhiResource.m_rhi;
    local_34.field_1.renderbuffer.renderbuffer = aVar1.buffer;
    if (pQVar2 != (QRhiImplementation *)0x0) {
      QtPrivate::QPodArrayOps<QRhiGles2::DeferredReleaseEntry>::
      emplace<QRhiGles2::DeferredReleaseEntry_const&>
                ((QPodArrayOps<QRhiGles2::DeferredReleaseEntry> *)&pQVar2[2].implThread,
                 pQVar2[2].resUpdPool.super_QVLABase<QRhiResourceUpdateBatch_*>.super_QVLABaseBase.s
                 ,&local_34);
      QList<QRhiGles2::DeferredReleaseEntry>::end
                ((QList<QRhiGles2::DeferredReleaseEntry> *)&pQVar2[2].implThread);
      local_28 = this;
      QHash<QRhiResource*,bool>::removeImpl<QRhiResource*>
                ((QHash<QRhiResource*,bool> *)&pQVar2->resources,(QRhiResource **)&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGles2Buffer::destroy()
{
    data.clear();
    if (!buffer)
        return;

    QRhiGles2::DeferredReleaseEntry e;
    e.type = QRhiGles2::DeferredReleaseEntry::Buffer;

    e.buffer.buffer = buffer;
    buffer = 0;

    QRHI_RES_RHI(QRhiGles2);
    if (rhiD) {
        rhiD->releaseQueue.append(e);
        rhiD->unregisterResource(this);
    }
}